

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

int __thiscall
QInternalMessageLogContext::initFrom
          (QInternalMessageLogContext *this,QMessageLogContext *logContext)

{
  bool bVar1;
  Type *pTVar2;
  QMessageLogContext *in_RDI;
  Type *pattern;
  QMessageLogContext *in_stack_ffffffffffffffe0;
  int local_4;
  
  in_RDI->version = 3;
  QMessageLogContext::copyContextFrom(in_stack_ffffffffffffffe0,in_RDI);
  bVar1 = std::optional<QVarLengthArray<void_*,_32LL>_>::has_value
                    ((optional<QVarLengthArray<void_*,_32LL>_> *)0x247fb8);
  if (bVar1) {
    local_4 = 0;
  }
  else {
    pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>::
             operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>
                         *)in_RDI);
    if (pTVar2 == (Type *)0x0) {
      local_4 = 0;
    }
    else {
      local_4 = pTVar2->maxBacktraceDepth;
    }
  }
  return local_4;
}

Assistant:

int QInternalMessageLogContext::initFrom(const QMessageLogContext &logContext)
{
    version = CurrentVersion + 1;
    copyContextFrom(logContext);

#ifdef QLOGGING_HAVE_BACKTRACE
    if (backtrace.has_value())
        return 0;       // we have a stored backtrace, no need to get it again

    // initializes the message pattern, if needed
    if (auto pattern = qMessagePattern())
        return pattern->maxBacktraceDepth;
#endif

    return 0;
}